

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

void FILEDosToUnixPathW(LPWSTR lpPath)

{
  char16_t cVar1;
  size_t sVar2;
  WCHAR WVar3;
  LPWSTR string;
  LPWSTR pWVar4;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpPath == (LPWSTR)0x0) {
      return;
    }
    pWVar4 = (LPWSTR)0x0;
    WVar3 = L'\0';
    string = lpPath;
    do {
      cVar1 = *string;
      if (cVar1 == L'\\') {
        *string = L'/';
        if (pWVar4 != (LPWSTR)0x0) {
joined_r0x00127397:
          if ((ushort)(WVar3 + L'￐') < 0xfffe) {
            sVar2 = PAL_wcslen(string);
            memmove(pWVar4,string,sVar2 * 2 + 2);
            string = pWVar4;
          }
        }
LAB_00127401:
        pWVar4 = (LPWSTR)0x0;
      }
      else {
        if (cVar1 == L'\0') goto LAB_00127416;
        if (pWVar4 == (LPWSTR)0x0) {
          if (cVar1 == L'.') {
            pWVar4 = string;
            if (string == lpPath) {
              WVar3 = *lpPath;
            }
            else {
              WVar3 = string[-1];
            }
            goto LAB_00127404;
          }
          goto LAB_00127401;
        }
        if (cVar1 == L'*') {
          if (4 < (long)string - (long)lpPath) {
            if ((string[-2] == L'*') && (string[-1] == L'.')) {
              sVar2 = PAL_wcslen(string);
              memmove(string + -2,string,sVar2 * 2);
            }
            goto LAB_00127401;
          }
        }
        else if (cVar1 != L'.') {
          if (cVar1 == L'/') goto joined_r0x00127397;
          goto LAB_00127401;
        }
      }
LAB_00127404:
      string = string + 1;
    } while( true );
  }
LAB_00127449:
  abort();
LAB_00127416:
  if ((pWVar4 != lpPath && pWVar4 != (LPWSTR)0x0) && (pWVar4[-1] != L'/')) {
    *pWVar4 = L'\0';
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return;
  }
  goto LAB_00127449;
}

Assistant:

void
FILEDosToUnixPathW(
       LPWSTR lpPath)
{
    LPWSTR p;
    LPWSTR pPointAtDot=NULL;
    WCHAR charBeforeFirstDot='\0';

    TRACE("Original DOS path = [%S]\n", lpPath);

    if (!lpPath)
    {
        return;
    }

    for (p = lpPath; *p; p++)
    {
        /* Make the \\ to / switch first */
        if (*p == '\\')
        {
            /* Replace \ with / */
            *p = '/';
        }

        if (pPointAtDot)
        {
            /* If pPointAtDot is not NULL, it is pointing at the first encountered
               dot.  If we encountered a \, that means it could be a trailing dot */
            if (*p == '/')
            {
                /* If char before the first dot is a '\' or '.' (special case if the
                   dot is the first char in the path) , then we leave it alone,
                   because it is either . or .., otherwise it is a trailing dot
                   pattern and will be truncated */
                if (charBeforeFirstDot != '.' && charBeforeFirstDot != '/')
                {
                    memmove(pPointAtDot,p,((PAL_wcslen(p)+1)*sizeof(WCHAR)));
                    p = pPointAtDot;
                }
                pPointAtDot = NULL; /* Need to reset this */
            }
            else if (*p == '*')
            {
                /* Check our size before doing anything with our pointers */
                if ((p - lpPath) >= 3)
                {
                    /* At this point, we know that there is 1 or more dots and
                       then a star.  AND we know the size of our string at this
                       point is at least 3 (so we can go backwards from our pointer
                       safely AND there could possilby be two characters back)
                       So lets check if there is a '*' and a '.' before, if there
                       is, replace just a '*'.  Otherwise, reset pPointAtDot to NULL
                       and do nothing */
                    if (p[-2] == '*' &&
                        p[-1] == '.' &&
                        p[0] == '*')
                    {
                        memmove(&(p[-2]),p,(PAL_wcslen(p)*sizeof(WCHAR)));
                    }

                    pPointAtDot  = NULL;
                }
            }
            else if (*p != '.')
            {
                /* If we are here, that means that this is NOT a trailing dot,
                   some other character is here, so forget our pointer */
                pPointAtDot = NULL;
            }
        }
        else
        {
            if (*p == '.')
            {
                /* If pPointAtDot is NULL, and we encounter a dot, save the pointer */
                pPointAtDot = p;
                if (pPointAtDot != lpPath)
                {
                    charBeforeFirstDot = p[-1];
                }
                else
                {
                    charBeforeFirstDot = lpPath[0];
                }
            }
        }
    }

    /* If pPointAtDot still points at anything, then we still have trailing dots.
       Truncate at pPointAtDot, unless the dots are path specifiers (. or ..) */
    if (pPointAtDot)
    {
        /* make sure the trailing dots don't follow a '/', and that they aren't
           the only thing in the name */
        if(pPointAtDot != lpPath && *(pPointAtDot-1) != '/')
        {
            *pPointAtDot = '\0';
        }
    }

    TRACE("Resulting Unix path = [%S]\n", lpPath);
}